

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_a<ncnn::BinaryOp_x86_functor::binary_op_add>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  float fVar1;
  undefined8 local_108;
  undefined8 uStack_100;
  int local_bc;
  float *local_a8;
  float *local_a0;
  __m128 _outp;
  __m128 _b;
  __m128 _a_128;
  float fStack_38;
  int i;
  float a;
  float fStack_2c;
  binary_op_add op;
  int elempack_local;
  int size_local;
  float *outptr_local;
  float *ptr1_local;
  float *ptr_local;
  
  fVar1 = *ptr;
  local_bc = 0;
  local_a8 = outptr;
  local_a0 = ptr1;
  if (elempack == 4) {
    local_108 = *(undefined8 *)ptr;
    uStack_100 = *(undefined8 *)(ptr + 2);
  }
  else {
    local_108 = CONCAT44(fVar1,fVar1);
    uStack_100 = CONCAT44(fVar1,fVar1);
  }
  for (; local_bc + 3 < size; local_bc = local_bc + 4) {
    elempack_local = (int)local_108;
    size_local = (int)((ulong)local_108 >> 0x20);
    outptr_local._0_4_ = (float)uStack_100;
    outptr_local._4_4_ = (float)((ulong)uStack_100 >> 0x20);
    fStack_38 = (float)*(undefined8 *)local_a0;
    i = (int)((ulong)*(undefined8 *)local_a0 >> 0x20);
    a = (float)*(undefined8 *)(local_a0 + 2);
    fStack_2c = (float)((ulong)*(undefined8 *)(local_a0 + 2) >> 0x20);
    *(ulong *)local_a8 = CONCAT44((float)size_local + (float)i,(float)elempack_local + fStack_38);
    *(ulong *)(local_a8 + 2) = CONCAT44(outptr_local._4_4_ + fStack_2c,outptr_local._0_4_ + a);
    local_a0 = local_a0 + 4;
    local_a8 = local_a8 + 4;
  }
  for (; local_bc < size; local_bc = local_bc + 1) {
    *local_a8 = fVar1 + *local_a0;
    local_a0 = local_a0 + 1;
    local_a8 = local_a8 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_a(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float a = *ptr;

    int i = 0;
#if __SSE2__
    __m128 _a_128 = (elempack == 4) ? _mm_loadu_ps(ptr) : _mm_set1_ps(a);
#if __AVX__
    __m256 _a_256 = (elempack == 8) ? _mm256_loadu_ps(ptr) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a_128), _a_128, 1);
#if __AVX512F__
    __m512 _a_512 = (elempack == 16) ? _mm512_loadu_ps(ptr) : _mm512_insertf32x8(_mm512_castps256_ps512(_a_256), _a_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_a_512, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_a_256, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_a_128, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(a, *ptr1);
        ptr1 += 1;
        outptr += 1;
    }
}